

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_vertexbuffer.cpp
# Opt level: O0

void __thiscall FFlatVertexBuffer::BindVBO(FFlatVertexBuffer *this)

{
  FFlatVertexBuffer *this_local;
  
  (*_ptrc_glBindBuffer)(0x8892,(this->super_FVertexBuffer).vbo_id);
  if ((gl.legacyMode & 1U) == 0) {
    (*_ptrc_glVertexAttribPointer)(0,3,0x1406,'\0',0x14,(void *)0x0);
    (*_ptrc_glVertexAttribPointer)(1,2,0x1406,'\0',0x14,(void *)0xc);
    (*_ptrc_glEnableVertexAttribArray)(0);
    (*_ptrc_glEnableVertexAttribArray)(1);
    (*_ptrc_glDisableVertexAttribArray)(2);
    (*_ptrc_glDisableVertexAttribArray)(3);
  }
  else {
    (*_ptrc_glVertexPointer)(3,0x1406,0x14,this->map);
    (*_ptrc_glTexCoordPointer)(2,0x1406,0x14,&this->map->u);
    (*_ptrc_glEnableClientState)(0x8074);
    (*_ptrc_glEnableClientState)(0x8078);
    (*_ptrc_glDisableClientState)(0x8076);
  }
  return;
}

Assistant:

void FFlatVertexBuffer::BindVBO()
{
	glBindBuffer(GL_ARRAY_BUFFER, vbo_id);
	if (!gl.legacyMode)
	{
		glVertexAttribPointer(VATTR_VERTEX, 3, GL_FLOAT, false, sizeof(FFlatVertex), &VTO->x);
		glVertexAttribPointer(VATTR_TEXCOORD, 2, GL_FLOAT, false, sizeof(FFlatVertex), &VTO->u);
		glEnableVertexAttribArray(VATTR_VERTEX);
		glEnableVertexAttribArray(VATTR_TEXCOORD);
		glDisableVertexAttribArray(VATTR_COLOR);
		glDisableVertexAttribArray(VATTR_VERTEX2);
	}
	else
	{
		glVertexPointer(3, GL_FLOAT, sizeof(FFlatVertex), &map->x);
		glTexCoordPointer(2, GL_FLOAT, sizeof(FFlatVertex), &map->u);
		glEnableClientState(GL_VERTEX_ARRAY);
		glEnableClientState(GL_TEXTURE_COORD_ARRAY);
		glDisableClientState(GL_COLOR_ARRAY);
	}
}